

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

AtomicRMW * __thiscall MixedArena::alloc<wasm::AtomicRMW>(MixedArena *this)

{
  AtomicRMW *pAVar1;
  
  pAVar1 = (AtomicRMW *)allocSpace(this,0x40,8);
  *(undefined8 *)&(pAVar1->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression = 0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id = 0;
  pAVar1->op = RMWAdd;
  pAVar1->bytes = '\0';
  *(undefined3 *)&pAVar1->field_0x15 = 0;
  (pAVar1->offset).addr = 0;
  pAVar1->ptr = (Expression *)0x0;
  pAVar1->value = (Expression *)0x0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression._id = AtomicRMWId;
  (pAVar1->memory).super_IString.str._M_len = 0;
  (pAVar1->memory).super_IString.str._M_str = (char *)0x0;
  return pAVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }